

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O2

bool burst::detail::
     collect_impl<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,0ul,1ul,2ul,3ul>
               (int *first,int *last,long param_3,long *param_4)

{
  pair<long_*,_long> pVar1;
  bool is_sorted;
  uint previous;
  undefined1 local_5a;
  undefined1 local_59;
  long local_58;
  undefined1 local_4e [2];
  undefined4 local_4c;
  long *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined4 *local_30;
  undefined1 *local_28;
  
  local_30 = &local_4c;
  local_4c = 0;
  local_48 = &local_58;
  local_28 = &local_5a;
  local_5a = 1;
  local_40 = local_4e;
  local_38 = &local_59;
  local_58 = param_3;
  for (; first != last; first = first + 1) {
    collect_impl<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,0ul,1ul,2ul,3ul>(__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>)
    ::{lambda(auto:1_const&)#1}::operator()((_lambda_auto_1_const___1_ *)&local_48,first);
  }
  pVar1 = partial_sum_max<long*,long*,std::plus<void>,std::less<void>>
                    (local_58,local_58 + 0x800,local_58);
  *param_4 = pVar1.second;
  pVar1 = partial_sum_max<long*,long*,std::plus<void>,std::less<void>>
                    (local_58 + 0x800,local_58 + 0x1000,local_58 + 0x800);
  param_4[1] = pVar1.second;
  pVar1 = partial_sum_max<long*,long*,std::plus<void>,std::less<void>>
                    (local_58 + 0x1000,local_58 + 0x1800,local_58 + 0x1000);
  param_4[2] = pVar1.second;
  pVar1 = partial_sum_max<long*,long*,std::plus<void>,std::less<void>>
                    (local_58 + 0x1800,local_58 + 0x2000,local_58 + 0x1800);
  param_4[3] = pVar1.second;
  return (bool)local_5a;
}

Assistant:

bool collect_impl (ForwardIterator first, ForwardIterator last, Map map, Radix radix, RandomAccessIterator1 counters, RandomAccessIterator2 maximums, std::index_sequence<Radices...>)
        {
            using value_type = iterator_value_t<ForwardIterator>;
            constexpr auto radix_value_range = radix_sort_traits<value_type, Map, Radix>::radix_value_range;

            auto previous = std::numeric_limits<invoke_result_t<Map, value_type>>::min();
            auto is_sorted = true;
            std::for_each(first, last,
                [& counters, & map, & radix, & previous, & is_sorted] (const auto & preimage)
                {
                    auto image = map(preimage);
                    is_sorted &= (image >= previous);
                    previous = image;

                    BURST_EXPAND_VARIADIC(++counters[Radices][nth_radix(Radices, radix)(image)]);
                });

            BURST_EXPAND_VARIADIC(maximums[Radices] = partial_sum_max(counters[Radices], counters[Radices] + radix_value_range, counters[Radices]).second);

            return is_sorted;
        }